

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  long *plVar8;
  ulong uVar9;
  ulong *puVar10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer __rhs;
  _Base_ptr p_Var15;
  _Alloc_hider _Var16;
  ulong uVar17;
  bool bVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  String *local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  _Base_ptr local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  pointer local_f0;
  _Base_ptr local_e8;
  undefined2 *local_e0;
  _Base_ptr local_d8;
  undefined2 local_d0;
  undefined1 local_ce;
  undefined1 *local_c0;
  ulong local_b8;
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Base_ptr local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Base_ptr local_38;
  
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  if ((_Rb_tree_header *)cVar7._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar14 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar14;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_168 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_118," ",g);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      paVar1 = &local_188.field_2;
      puVar10 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_188.field_2._M_allocated_capacity = *puVar10;
        local_188.field_2._8_8_ = plVar8[3];
        local_188._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar10;
        local_188._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_160.first._M_string_length = plVar8[1];
      *plVar8 = (long)puVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      paVar2 = &local_160.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar1) {
        local_160.first.field_2._8_8_ = local_188.field_2._8_8_;
        local_188._M_dataplus._M_p = (pointer)paVar2;
      }
      local_160.first.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
      local_188._M_string_length = 0;
      local_188.field_2._M_allocated_capacity =
           local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_160.first._M_dataplus._M_p = local_188._M_dataplus._M_p;
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_append((char *)local_168,(ulong)local_160.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_160.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    __rhs = *(pointer *)(cVar7._M_node + 4);
    local_f0 = (pointer)cVar7._M_node[4]._M_parent;
    __return_storage_ptr__ = local_168;
    local_f8 = paVar14;
    if (__rhs != local_f0) {
      paVar14 = &local_160.second.field_2;
      local_120 = (_Base_ptr)0x0;
      local_e8 = cVar7._M_node;
      do {
        local_e0 = &local_d0;
        local_d0 = 0x2020;
        local_d8 = (_Base_ptr)0x2;
        local_ce = 0;
        if ((_Base_ptr)(__rhs->first)._M_string_length == (_Base_ptr)0x0) {
          std::__cxx11::string::append((char *)&local_e0);
        }
        else {
          std::operator+(&local_188,"-",&__rhs->first);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
          puVar10 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_160.first.field_2._M_allocated_capacity = *puVar10;
            local_160.first.field_2._8_8_ = plVar8[3];
          }
          else {
            local_160.first.field_2._M_allocated_capacity = *puVar10;
            local_160.first._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_160.first._M_string_length = plVar8[1];
          *plVar8 = (long)puVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_160.first._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        if ((__rhs->second)._M_string_length != 0) {
          std::operator+(&local_160.first," --",&__rhs->second);
          std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_160.first._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
        }
        if (*(char *)&__rhs[1].second._M_dataplus._M_p == '\x01') {
          lVar3 = *(long *)((long)&__rhs[2].second.field_2 + 8);
          local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
          if (lVar3 == 0) {
            local_160.first._M_string_length = 3;
            local_160.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
          }
          else {
            sVar4 = __rhs[2].second.field_2._M_allocated_capacity;
            std::__cxx11::string::_M_construct<char*>((string *)&local_160,sVar4,sVar4 + lVar3);
          }
          if (*(char *)&__rhs[2].first._M_string_length == '\x01') {
            std::operator+(&local_78," [=",&local_160.first);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_a0.field_2._M_allocated_capacity = *psVar11;
              local_a0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar11;
              local_a0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_a0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_a0,
                                        (ulong)__rhs[2].first.field_2._M_allocated_capacity);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            puVar10 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_118.field_2._M_allocated_capacity = *puVar10;
              local_118.field_2._8_8_ = plVar8[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar10;
              local_118._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_118._M_string_length = plVar8[1];
            *plVar8 = (long)puVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            puVar10 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_188.field_2._M_allocated_capacity = *puVar10;
              local_188.field_2._8_8_ = plVar8[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar10;
              local_188._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_188._M_string_length = plVar8[1];
            *plVar8 = (long)puVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_188._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            pbVar6 = &local_78;
            _Var12._M_p = local_78._M_dataplus._M_p;
          }
          else {
            std::operator+(&local_188," ",&local_160.first);
            std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_188._M_dataplus._M_p);
            pbVar6 = &local_188;
            _Var12._M_p = local_188._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var12._M_p != &pbVar6->field_2) {
            operator_delete(_Var12._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
        }
        if (local_120 <= local_d8) {
          local_120 = local_d8;
        }
        paVar1 = &local_188.field_2;
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
        local_188._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_e0,
                   (byte *)((long)&local_d8->_M_color + (long)local_e0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == paVar1) {
          local_160.second.field_2._8_8_ = local_188.field_2._8_8_;
          local_160.second._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_160.second._M_dataplus._M_p = local_188._M_dataplus._M_p;
        }
        local_160.second.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
        local_160.second._M_string_length = local_188._M_string_length;
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188._M_dataplus._M_p = (pointer)paVar1;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&local_58,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160.second._M_dataplus._M_p != paVar14) {
          operator_delete(local_160.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
          operator_delete(local_160.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0);
        }
        __rhs = (pointer)&__rhs[3].first.field_2;
      } while (__rhs != local_f0);
      p_Var15 = *(_Base_ptr *)(local_e8 + 4);
      local_38 = local_e8[4]._M_parent;
      local_80 = (_Base_ptr)0x1e;
      if (local_120 < (_Base_ptr)0x1e) {
        local_80 = local_120;
      }
      __return_storage_ptr__ = local_168;
      if (p_Var15 != local_38) {
        uVar17 = 0x4a - (long)local_80;
        local_f0 = local_58.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_120 = (_Base_ptr)((long)&local_80->_M_color + 2);
        do {
          local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,*(long *)(p_Var15 + 2),
                     (long)&(p_Var15[2]._M_parent)->_M_color + *(long *)(p_Var15 + 2));
          if (*(byte *)((long)&p_Var15[3]._M_color + 1) == 1) {
            std::operator+(&local_a0," (default:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_Var15[3]._M_parent);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
            paVar14 = &local_118.field_2;
            puVar10 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_118.field_2._M_allocated_capacity = *puVar10;
              local_118.field_2._8_8_ = plVar8[3];
              local_118._M_dataplus._M_p = (pointer)paVar14;
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar10;
              local_118._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_188._M_string_length = plVar8[1];
            *plVar8 = (long)puVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p == paVar14) {
              local_188.field_2._8_8_ = local_118.field_2._8_8_;
              local_118._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            local_188.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
            local_118._M_string_length = 0;
            local_118.field_2._M_allocated_capacity =
                 local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_188._M_dataplus._M_p = local_118._M_dataplus._M_p;
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_118._M_dataplus._M_p;
            local_118._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)paVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
          }
          local_c0 = local_b0;
          local_b8 = 0;
          local_b0[0] = 0;
          _Var12._M_p = local_160.first._M_dataplus._M_p;
          local_e8 = p_Var15;
          if (local_160.first._M_string_length != 0) {
            uVar9 = 0;
            _Var13._M_p = local_160.first._M_dataplus._M_p;
            _Var16._M_p = local_160.first._M_dataplus._M_p;
            do {
              if (*_Var16._M_p == ' ') {
                _Var13._M_p = _Var16._M_p;
              }
              if (uVar17 < uVar9) {
                if (_Var13._M_p == _Var12._M_p) {
                  std::__cxx11::string::replace
                            ((ulong)&local_c0,local_b8,(char *)0x0,(ulong)_Var12._M_p);
                  paVar14 = &local_78.field_2;
                  local_78.field_2._M_allocated_capacity._0_2_ = 10;
                  local_78._M_string_length = 1;
                  local_78._M_dataplus._M_p = (pointer)paVar14;
                  std::__cxx11::string::_M_append((char *)&local_c0,(ulong)paVar14);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != paVar14) {
                    operator_delete(local_78._M_dataplus._M_p);
                  }
                  std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,(char)local_120);
                  _Var12._M_p = _Var16._M_p + 1;
                  _Var13._M_p = _Var12._M_p;
                }
                else {
                  std::__cxx11::string::replace
                            ((ulong)&local_c0,local_b8,(char *)0x0,(ulong)_Var12._M_p);
                  local_d0 = 10;
                  local_d8 = (_Base_ptr)0x1;
                  local_e0 = &local_d0;
                  std::__cxx11::string::_M_append((char *)&local_c0,(ulong)&local_d0);
                  if (local_e0 != &local_d0) {
                    operator_delete(local_e0);
                  }
                  std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,(char)local_120);
                  _Var12._M_p = _Var13._M_p + 1;
                }
                uVar9 = 0;
              }
              else {
                uVar9 = uVar9 + 1;
              }
              _Var16._M_p = _Var16._M_p + 1;
            } while (_Var16._M_p !=
                     local_160.first._M_dataplus._M_p + local_160.first._M_string_length);
          }
          __return_storage_ptr__ = local_168;
          paVar14 = &local_160.first.field_2;
          std::__cxx11::string::replace((ulong)&local_c0,local_b8,(char *)0x0,(ulong)_Var12._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != paVar14) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(local_f0->first)._M_dataplus._M_p);
          p_Var5 = (_Base_ptr)(local_f0->first)._M_string_length;
          if (local_80 < p_Var5) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            paVar14 = &local_188.field_2;
            local_188._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct((ulong)&local_188,(char)local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p == paVar14) {
              local_160.first.field_2._8_8_ = local_188.field_2._8_8_;
              local_188._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            }
            local_160.first.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
            local_160.first._M_string_length = local_188._M_string_length;
            local_188._M_string_length = 0;
            local_188.field_2._M_allocated_capacity =
                 local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_160.first._M_dataplus._M_p = local_188._M_dataplus._M_p;
            local_188._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
            bVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_160.first._M_dataplus._M_p == &local_160.first.field_2;
          }
          else {
            paVar1 = &local_188.field_2;
            local_188._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct((ulong)&local_188,(char)local_120 - (char)p_Var5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p == paVar1) {
              local_160.first.field_2._8_8_ = local_188.field_2._8_8_;
              local_188._M_dataplus._M_p = (pointer)paVar14;
            }
            local_160.first.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
            local_160.first._M_string_length = local_188._M_string_length;
            local_188._M_string_length = 0;
            local_188.field_2._M_allocated_capacity =
                 local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_160.first._M_dataplus._M_p = local_188._M_dataplus._M_p;
            local_188._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
            bVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_160.first._M_dataplus._M_p == paVar14;
          }
          p_Var15 = local_e8;
          if (!bVar18) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (local_c0 != local_b0) {
            operator_delete(local_c0);
          }
          local_f0 = local_f0 + 1;
          p_Var15 = (_Base_ptr)&p_Var15[6]._M_left;
        } while (p_Var15 != local_38);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n\n");
  }

  for (const auto& o : group->second.options)
  {
    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += "\n";
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += "\n";

    ++fiter;
  }

  return result;
}